

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcx.c
# Opt level: O2

int pcx_parse_args(int i,int nb,int *a,int *b,int *c,int *d,int size)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if (nb == 2) {
    uVar4 = pcx_arg[i];
    uVar1 = pcx_arg[(long)i + 1];
  }
  else {
    if (nb != 0) {
      uVar3 = pcx_arg[i];
      uVar5 = pcx_arg[(long)i + 1];
      uVar4 = pcx_arg[(long)i + 2];
      uVar1 = pcx_arg[(long)i + 3];
      goto LAB_00111371;
    }
    uVar4 = pcx_w / size;
    uVar1 = pcx_h / size;
  }
  uVar3 = 0;
  uVar5 = 0;
LAB_00111371:
  if ((pcx_w < (int)(uVar4 * size + uVar3)) || (pcx_h < (int)(size * uVar1 + uVar5))) {
    error("Coordinates out of range!");
    iVar2 = 0;
  }
  else {
    *a = uVar3;
    *b = uVar5;
    *c = uVar4;
    *d = uVar1;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
pcx_parse_args(int i, int nb, int *a, int *b, int *c, int *d, int size)
{
	int x, y, w, h;

	x = 0;
	y = 0;

	/* get coordinates */
	if (nb == 0) {			/* no arg */
		w = (pcx_w / size);
		h = (pcx_h / size);
	}
	else if (nb == 2) {		/* 2 args */
		w = pcx_arg[i];
		h = pcx_arg[i+1];
	}
	else {					/* 4 args */
		x = pcx_arg[i];
		y = pcx_arg[i+1];
		w = pcx_arg[i+2];
		h = pcx_arg[i+3];
	}

	/* check */
	if (((x + w * size) > pcx_w) || ((y + h * size) > pcx_h)) {
		error("Coordinates out of range!");
		return (0);
	}

	/* write back the value */
	*a = x;
	*b = y;
	*c = w;
	*d = h;

	/* ok */
	return (1);
}